

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

bool QtPrivate::isBuiltinType(QByteArray *type)

{
  bool bVar1;
  int iVar2;
  QMetaType iface;
  storage_type *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView typeName;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  typeName.m_data = in_RDX;
  typeName.m_size = (qsizetype)(type->d).ptr;
  iface = QMetaType::fromName((QMetaType *)(type->d).size,typeName);
  if (iface.d_ptr == (QMetaTypeInterface *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = ((iface.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar2 == 0) {
      iVar2 = QMetaType::registerHelper(iface.d_ptr);
    }
  }
  if ((iVar2 == 0) && ((type->d).size != 0)) {
    local_20 = "void";
    bVar1 = ::operator!=(type,&local_20);
    if (bVar1) {
      bVar1 = false;
      goto LAB_0028b073;
    }
  }
  bVar1 = iVar2 < 0x10000;
LAB_0028b073:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT bool isBuiltinType(const QByteArray &type)
{
    int id = QMetaType::fromName(type).id();
    if (!id && !type.isEmpty() && type != "void")
        return false;
    return (id < QMetaType::User);
}